

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void * rw::ps2::copyADC(void *dst,void *src,int32 offset,int32 param_4)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  void *pvVar4;
  int32 size;
  ADCData *srcadc;
  ADCData *dstadc;
  int32 param_3_local;
  int32 offset_local;
  void *src_local;
  void *dst_local;
  
  piVar2 = (int *)((long)dst + (long)offset);
  piVar3 = (int *)((long)src + (long)offset);
  *piVar2 = *piVar3;
  if (*piVar2 != 0) {
    piVar2[4] = piVar3[4];
    uVar1 = piVar2[4] + 3U & 0xfffffffc;
    pvVar4 = mustmalloc_LOC((long)(int)uVar1,0x30134,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1246"
                           );
    *(void **)(piVar2 + 2) = pvVar4;
    memcpy(*(void **)(piVar2 + 2),*(void **)(piVar3 + 2),(long)(int)uVar1);
  }
  return dst;
}

Assistant:

static void*
copyADC(void *dst, void *src, int32 offset, int32)
{
	ADCData *dstadc = PLUGINOFFSET(ADCData, dst, offset);
	ADCData *srcadc = PLUGINOFFSET(ADCData, src, offset);
	dstadc->adcFormatted = srcadc->adcFormatted;
	if(!dstadc->adcFormatted)
		return dst;
	dstadc->numBits = srcadc->numBits;
	int32 size = dstadc->numBits+3 & ~3;
	dstadc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	memcpy(dstadc->adcBits, srcadc->adcBits, size);
	return dst;
}